

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O1

void lwsl_emit_stderr(int level,char *line)

{
  int iVar1;
  char buf [50];
  char acStack_48 [56];
  
  if (tty == '\0') {
    iVar1 = isatty(2);
    tty = (byte)iVar1 | 2;
  }
  lwsl_timestamp(level,acStack_48,0x32);
  if (tty == '\x03') {
    lwsl_emit_stderr_cold_1();
  }
  else {
    fprintf(_stderr,"%s%s",acStack_48,line);
  }
  return;
}

Assistant:

void
lwsl_emit_stderr(int level, const char *line)
{
	char buf[50];
	int n, m = LWS_ARRAY_SIZE(colours) - 1;

	if (!tty)
		tty = isatty(2) | 2;
	lwsl_timestamp(level, buf, sizeof(buf));

	if (tty == 3) {
		n = 1 << (LWS_ARRAY_SIZE(colours) - 1);
		while (n) {
			if (level & n)
				break;
			m--;
			n >>= 1;
		}
		fprintf(stderr, "%c%s%s%s%c[0m", 27, colours[m], buf, line, 27);
	} else
		fprintf(stderr, "%s%s", buf, line);
}